

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseBuilder::labelNodeOf(BaseBuilder *this,LabelNode **out,uint32_t labelId)

{
  ZoneVector<asmjit::v1_14::LabelNode_*> *this_00;
  CodeHolder *pCVar1;
  LabelNode *pLVar2;
  Error EVar3;
  LabelNode **ppLVar4;
  LabelNode *node;
  uint32_t labelId_local;
  
  *out = (LabelNode *)0x0;
  pCVar1 = (this->super_BaseEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    EVar3 = 5;
  }
  else if (labelId < *(uint *)&pCVar1->field_0x100) {
    this_00 = &this->_labelNodes;
    labelId_local = labelId;
    if ((labelId < *(uint *)&this->field_0x190) ||
       (EVar3 = ZoneVector<asmjit::v1_14::LabelNode_*>::resize
                          (this_00,&this->_allocator,labelId + 1), EVar3 == 0)) {
      ppLVar4 = ZoneVector<asmjit::v1_14::LabelNode_*>::operator[](this_00,(ulong)labelId);
      node = *ppLVar4;
      if (node == (LabelNode *)0x0) {
        EVar3 = _newNodeT<asmjit::v1_14::LabelNode,unsigned_int&>(this,&node,&labelId_local);
        pLVar2 = node;
        if (EVar3 != 0) {
          return EVar3;
        }
        ppLVar4 = ZoneVector<asmjit::v1_14::LabelNode_*>::operator[](this_00,(ulong)labelId);
        *ppLVar4 = pLVar2;
      }
      *out = node;
      EVar3 = 0;
    }
  }
  else {
    EVar3 = 0xc;
  }
  return EVar3;
}

Assistant:

Error BaseBuilder::labelNodeOf(LabelNode** out, uint32_t labelId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  uint32_t index = labelId;
  if (ASMJIT_UNLIKELY(index >= _code->labelCount()))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (index >= _labelNodes.size())
    ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, index + 1));

  LabelNode* node = _labelNodes[index];
  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<LabelNode>(&node, labelId));
    _labelNodes[index] = node;
  }

  *out = node;
  return kErrorOk;
}